

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O1

Promise<void> __thiscall
capnp::Capability::Server::internalUnimplemented
          (Server *this,char *interfaceName,uint64_t typeId,uint16_t methodId)

{
  char *pcVar1;
  size_t sVar2;
  ClientHook *pCVar3;
  undefined6 in_register_0000000a;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *pPVar4;
  Promise<void> PVar5;
  unsigned_short *in_stack_fffffffffffffe48;
  undefined1 local_1aa [2];
  String local_1a8;
  _func_int **local_190;
  ClientHook *pCStack_188;
  char *local_180;
  uint64_t local_178;
  Exception local_170;
  
  local_180 = (char *)CONCAT62(in_register_0000000a,methodId);
  local_178 = typeId;
  kj::_::Debug::makeDescription<char_const(&)[24],char_const*&,unsigned_long&,unsigned_short&>
            (&local_1a8,(Debug *)"\"Method not implemented.\", interfaceName, typeId, methodId",
             "Method not implemented.",(char (*) [24])&local_178,&local_180,
             (unsigned_long *)local_1aa,in_stack_fffffffffffffe48);
  kj::Exception::Exception
            (&local_170,UNIMPLEMENTED,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability.c++"
             ,0x50,&local_1a8);
  kj::heap<kj::_::ImmediateBrokenPromiseNode,kj::Exception>((kj *)&local_190,&local_170);
  pCVar3 = pCStack_188;
  pCStack_188 = (ClientHook *)0x0;
  this->_vptr_Server = local_190;
  this->thisHook = pCVar3;
  kj::Exception::~Exception(&local_170);
  sVar2 = local_1a8.content.size_;
  pcVar1 = local_1a8.content.ptr;
  pPVar4 = extraout_RDX;
  if (local_1a8.content.ptr != (char *)0x0) {
    local_1a8.content.ptr = (char *)0x0;
    local_1a8.content.size_ = 0;
    (**(local_1a8.content.disposer)->_vptr_ArrayDisposer)
              (local_1a8.content.disposer,pcVar1,1,sVar2,sVar2,0);
    pPVar4 = extraout_RDX_00;
  }
  PVar5.super_PromiseBase.node.ptr = pPVar4;
  PVar5.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar5.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> Capability::Server::internalUnimplemented(
    const char* interfaceName, uint64_t typeId, uint16_t methodId) {
  return KJ_EXCEPTION(UNIMPLEMENTED, "Method not implemented.", interfaceName, typeId, methodId);
}